

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_osd.cpp
# Opt level: O0

char * __thiscall bp_osd::bp_osd_decode(bp_osd *this,char *synd)

{
  char *pcVar1;
  ostream *this_00;
  void *this_01;
  long in_RDI;
  int unaff_retaddr;
  double *in_stack_00000008;
  char *in_stack_00000010;
  char *in_stack_00000018;
  mod2sparse *in_stack_00000020;
  int i;
  int in_stack_0000005c;
  double *in_stack_00000060;
  char *in_stack_00000068;
  char *in_stack_00000070;
  undefined4 in_stack_00000078;
  int in_stack_0000007c;
  mod2sparse *in_stack_00000080;
  char *in_stack_00000088;
  int in_stack_00000090;
  undefined4 in_stack_00000094;
  char **in_stack_00000098;
  int in_stack_000000a0;
  undefined4 in_stack_000000a4;
  int in_stack_000000b0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  bp_osd *in_stack_ffffffffffffffd0;
  int local_1c;
  char *local_8;
  
  pcVar1 = bp_decode(in_stack_ffffffffffffffd0,
                     (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  *(char **)(in_RDI + 0x50) = pcVar1;
  if (**(int **)(in_RDI + 0x38) == 0) {
    if ((*(int *)(in_RDI + 0x48) == 0) || (*(int *)(in_RDI + 0x48) == 1)) {
      osd_w(in_stack_00000080,(char *)CONCAT44(in_stack_0000007c,in_stack_00000078),
            in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_0000005c,
            in_stack_00000090,in_stack_00000098,in_stack_000000a0);
    }
    else if (*(int *)(in_RDI + 0x48) == 2) {
      osd_0(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
      *(undefined8 *)(in_RDI + 0x60) = *(undefined8 *)(in_RDI + 0x58);
    }
    else {
      if (*(int *)(in_RDI + 0x48) != 3) {
        this_00 = std::operator<<((ostream *)&std::cout,
                                  "ERROR. <Function bp_osd::bp_osd_decode>. Invalid OSD method! Method: "
                                 );
        this_01 = (void *)std::ostream::operator<<(this_00,*(int *)(in_RDI + 0x48));
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        exit(0x16);
      }
      osd_g((mod2sparse *)CONCAT44(in_stack_000000a4,in_stack_000000a0),(char *)in_stack_00000098,
            (char *)CONCAT44(in_stack_00000094,in_stack_00000090),in_stack_00000088,
            (double *)in_stack_00000080,in_stack_0000007c,in_stack_000000b0);
    }
    local_8 = *(char **)(in_RDI + 0x60);
  }
  else {
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0xc); local_1c = local_1c + 1) {
      *(undefined1 *)(*(long *)(in_RDI + 0x58) + (long)local_1c) =
           *(undefined1 *)(*(long *)(in_RDI + 0x50) + (long)local_1c);
      *(undefined1 *)(*(long *)(in_RDI + 0x60) + (long)local_1c) =
           *(undefined1 *)(*(long *)(in_RDI + 0x50) + (long)local_1c);
    }
    local_8 = *(char **)(in_RDI + 0x50);
  }
  return local_8;
}

Assistant:

char *bp_osd::bp_osd_decode(char *synd) {

    bp_decoding=bp_decode(synd);

    if(*converge){
        for(int i=0;i<N;i++) {
            osd0_decoding[i] = bp_decoding[i];
            osdw_decoding[i] = bp_decoding[i];
        }
        return bp_decoding;
    }

    if((osd_method==0)||(osd_method==1))
        osd_w(
                H,
                synd,
                osd0_decoding,
                osdw_decoding,
                log_prob_ratios,
                osd_order, rank,
                osd_w_encoding_inputs,
                encoding_input_count
        );

    else if(osd_method==2){
        osd_0(
                H,
                synd,
                osd0_decoding,
                log_prob_ratios,
                rank
                );
        osdw_decoding=osd0_decoding;
    }

    else if(osd_method==3){
        osd_g(
                H,
                synd,
                osd0_decoding,
                osdw_decoding,
                log_prob_ratios,
                osd_order,
                rank
        );
    }

    else {
        cout << "ERROR. <Function bp_osd::bp_osd_decode>. Invalid OSD method! Method: "<<osd_method << endl;
        exit(22);
    }

//    test_correct_synd(osd0_decoding,synd);
//    test_correct_synd(osdw_decoding,synd);

//    osd0_decoding=osd_data[0].decoding;
//    osdw_decoding=osd_data[1].decoding;

    return osdw_decoding;

}